

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O3

bool __thiscall
cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)>::parse<unsigned_long,cmake*>
          (cmCommandLineArgument<bool(std::__cxx11::string_const&,cmake*)> *this,string *input,
          unsigned_long *index,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *allArgs,cmake **state)

{
  ulong uVar1;
  unsigned_long uVar2;
  pointer pcVar3;
  char *pcVar4;
  unsigned_long *puVar5;
  byte bVar6;
  pointer pbVar7;
  size_type sVar8;
  cmake *pcVar9;
  ulong uVar10;
  long lVar11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  ParseMode parseState;
  string buffer;
  string value;
  ParseMode local_cc;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  size_type local_88;
  char *local_80;
  undefined8 local_78;
  undefined8 local_70;
  ulong local_68;
  unsigned_long *local_60;
  cmake **local_58;
  string local_50;
  
  local_cc = 0;
  switch(*(int *)(this + 0x60)) {
  case 0:
    sVar8 = input->_M_string_length;
    if (sVar8 == *(size_type *)(this + 0x48)) {
      local_a8._0_8_ = local_a8 + 0x10;
      local_a8._8_8_ = (cmake *)0x0;
      local_a8._16_8_ = (ulong)(uint7)local_a8._17_7_ << 8;
      local_c8._0_8_ = *state;
      if (*(long *)(this + 0x78) == 0) {
        std::__throw_bad_function_call();
      }
      bVar6 = (**(code **)(this + 0x80))(this + 0x68,local_a8,local_c8);
LAB_002a9406:
      local_cc = (ParseMode)(bVar6 ^ 1);
      sVar8 = local_a8._16_8_;
      pcVar9 = (cmake *)local_a8._0_8_;
      if ((cmake *)local_a8._0_8_ != (cmake *)(local_a8 + 0x10)) goto LAB_002a9527;
      break;
    }
    local_cc = 2;
    goto LAB_002a955d;
  case 1:
  case 3:
    if (input->_M_string_length == *(size_type *)(this + 0x48)) {
      uVar10 = *index + 1;
      pbVar7 = (allArgs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (((ulong)((long)(allArgs->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5) <= uVar10)
         || (*pbVar7[uVar10]._M_dataplus._M_p == '-')) {
        if (*(int *)(this + 0x60) != 3) goto LAB_002a946e;
        local_a8._0_8_ = local_a8 + 0x10;
        local_a8._8_8_ = (cmake *)0x0;
        local_a8._16_8_ = (ulong)(uint7)local_a8._17_7_ << 8;
        local_c8._0_8_ = *state;
        if (*(long *)(this + 0x78) == 0) {
          std::__throw_bad_function_call();
        }
        bVar6 = (**(code **)(this + 0x80))(this + 0x68,local_a8,local_c8);
        goto LAB_002a9406;
      }
      local_a8._0_8_ = *state;
      if (*(long *)(this + 0x78) == 0) {
        std::__throw_bad_function_call();
      }
      bVar6 = (**(code **)(this + 0x80))(this + 0x68,pbVar7 + uVar10,local_a8);
      local_cc = (ParseMode)(bVar6 ^ 1);
      *index = uVar10;
    }
    else {
      cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
      ::extract_single_value
                ((string *)local_a8,
                 (cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                  *)this,input,&local_cc);
      if (local_cc == 0) {
        local_c8._0_8_ = *state;
        if (*(long *)(this + 0x78) == 0) {
          std::__throw_bad_function_call();
        }
        bVar6 = (**(code **)(this + 0x80))(this + 0x68,local_a8,local_c8);
LAB_002a950b:
        local_cc = (ParseMode)(bVar6 ^ 1);
      }
LAB_002a9514:
      sVar8 = local_a8._16_8_;
      pcVar9 = (cmake *)local_a8._0_8_;
      if ((cmake *)local_a8._0_8_ != (cmake *)(local_a8 + 0x10)) goto LAB_002a9527;
    }
    break;
  case 2:
    if (input->_M_string_length != *(size_type *)(this + 0x48)) break;
    uVar2 = *index;
    uVar10 = uVar2 + 2;
    pbVar7 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar10 < (ulong)((long)(allArgs->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5)) {
      pcVar9 = (cmake *)pbVar7[uVar2 + 1]._M_dataplus._M_p;
      if (*(char *)&pcVar9->Generators != '-') {
        pcVar4 = pbVar7[uVar10]._M_dataplus._M_p;
        if (*pcVar4 != '-') {
          *index = uVar10;
          local_a8._0_8_ = pbVar7[uVar2 + 1]._M_string_length;
          local_a8._16_8_ = 1;
          local_a8._24_8_ = (long)":/\\;" + 3;
          local_88 = pbVar7[uVar10]._M_string_length;
          views_01._M_len = 3;
          views_01._M_array = (iterator)local_a8;
          local_a8._8_8_ = pcVar9;
          local_80 = pcVar4;
          cmCatViews_abi_cxx11_((string *)local_c8,views_01);
          local_a8._0_8_ = *state;
          if (*(long *)(this + 0x78) == 0) {
            std::__throw_bad_function_call();
          }
          bVar6 = (**(code **)(this + 0x80))(this + 0x68,local_c8,local_a8);
          goto LAB_002a96a4;
        }
      }
    }
LAB_002a946e:
    local_cc = 3;
    goto LAB_002a9547;
  case 4:
    if (input->_M_string_length != *(size_type *)(this + 0x48)) {
      cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
      ::extract_single_value
                ((string *)local_a8,
                 (cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
                  *)this,input,&local_cc);
      if (local_cc == 0) {
        local_c8._0_8_ = *state;
        if (*(long *)(this + 0x78) == 0) {
          std::__throw_bad_function_call();
        }
        bVar6 = (**(code **)(this + 0x80))(this + 0x68,local_a8,local_c8);
        goto LAB_002a950b;
      }
      goto LAB_002a9514;
    }
    uVar2 = *index;
    uVar10 = uVar2 + 1;
    pbVar7 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((ulong)((long)(allArgs->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5) <= uVar10)
       || (*pbVar7[uVar10]._M_dataplus._M_p == '-')) goto LAB_002a946e;
    uVar1 = uVar2 + 2;
    local_c8._0_8_ = local_c8 + 0x10;
    pcVar3 = pbVar7[uVar10]._M_dataplus._M_p;
    local_60 = index;
    local_58 = state;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,pcVar3,pcVar3 + pbVar7[uVar10]._M_string_length);
    pbVar7 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_68 = uVar1;
    if (uVar1 < (ulong)((long)(allArgs->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5)) {
      lVar11 = uVar2 * 0x20 + 0x40;
      do {
        if (**(char **)((long)&(pbVar7->_M_dataplus)._M_p + lVar11) == '-') break;
        local_a8._0_8_ = local_c8._8_8_;
        local_a8._8_8_ = local_c8._0_8_;
        local_a8._16_8_ = 1;
        local_a8._24_8_ = (long)":/\\;" + 3;
        local_80 = *(char **)((long)&(pbVar7->_M_dataplus)._M_p + lVar11);
        local_88 = *(size_type *)((long)&pbVar7->_M_string_length + lVar11);
        views._M_len = 3;
        views._M_array = (iterator)local_a8;
        cmCatViews_abi_cxx11_(&local_50,views);
        std::__cxx11::string::operator=((string *)local_c8,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._0_8_ + 1);
        }
        local_68 = local_68 + 1;
        pbVar7 = (allArgs->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 0x20;
      } while (local_68 <
               (ulong)((long)(allArgs->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5));
    }
    puVar5 = local_60;
    local_a8._0_8_ = *local_58;
    if (*(long *)(this + 0x78) == 0) {
      std::__throw_bad_function_call();
    }
    bVar6 = (**(code **)(this + 0x80))(this + 0x68,local_c8,local_a8);
    *puVar5 = local_68 - 1;
LAB_002a96a4:
    local_cc = (ParseMode)(bVar6 ^ 1);
    sVar8 = local_c8._16_8_;
    pcVar9 = (cmake *)local_c8._0_8_;
    if ((cmake *)local_c8._0_8_ == (cmake *)(local_c8 + 0x10)) break;
LAB_002a9527:
    operator_delete(pcVar9,sVar8 + 1);
    break;
  default:
    goto switchD_002a917b_default;
  }
  if (local_cc == 3) {
LAB_002a9547:
    cmSystemTools::Error((string *)(this + 0x20));
  }
  else if (local_cc == 2) {
    sVar8 = input->_M_string_length;
LAB_002a955d:
    local_a8._24_8_ = (input->_M_dataplus)._M_p;
    local_a8._0_8_ = (pointer)0x1;
    local_a8._8_8_ = "\'";
    local_88 = 1;
    local_80 = "\'";
    local_70 = *(undefined8 *)this;
    local_78 = *(undefined8 *)(this + 8);
    views_00._M_len = 4;
    views_00._M_array = (iterator)local_a8;
    local_a8._16_8_ = sVar8;
    cmCatViews_abi_cxx11_((string *)local_c8,views_00);
    cmSystemTools::Error((string *)local_c8);
    if ((cmake *)local_c8._0_8_ != (cmake *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
  }
switchD_002a917b_default:
  return local_cc == 0;
}

Assistant:

bool parse(std::string const& input, T& index,
             std::vector<std::string> const& allArgs,
             CallState&&... state) const
  {
    ParseMode parseState = ParseMode::Valid;

    if (this->Type == Values::Zero) {
      if (input.size() == this->Name.size()) {
        parseState =
          this->StoreCall(std::string{}, std::forward<CallState>(state)...)
          ? ParseMode::Valid
          : ParseMode::Invalid;
      } else {
        parseState = ParseMode::SyntaxError;
      }

    } else if (this->Type == Values::One || this->Type == Values::ZeroOrOne) {
      if (input.size() == this->Name.size()) {
        auto nextValueIndex = index + 1;
        if (nextValueIndex >= allArgs.size() ||
            allArgs[nextValueIndex][0] == '-') {
          if (this->Type == Values::ZeroOrOne) {
            parseState =
              this->StoreCall(std::string{}, std::forward<CallState>(state)...)
              ? ParseMode::Valid
              : ParseMode::Invalid;
          } else {
            parseState = ParseMode::ValueError;
          }
        } else {
          parseState = this->StoreCall(allArgs[nextValueIndex],
                                       std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
          index = nextValueIndex;
        }
      } else {
        auto value = this->extract_single_value(input, parseState);
        if (parseState == ParseMode::Valid) {
          parseState =
            this->StoreCall(value, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    } else if (this->Type == Values::Two) {
      if (input.size() == this->Name.size()) {
        if (index + 2 >= allArgs.size() || allArgs[index + 1][0] == '-' ||
            allArgs[index + 2][0] == '-') {
          parseState = ParseMode::ValueError;
        } else {
          index += 2;
          parseState =
            this->StoreCall(cmStrCat(allArgs[index - 1], ";", allArgs[index]),
                            std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    } else if (this->Type == Values::OneOrMore) {
      if (input.size() == this->Name.size()) {
        auto nextValueIndex = index + 1;
        if (nextValueIndex >= allArgs.size() ||
            allArgs[nextValueIndex][0] == '-') {
          parseState = ParseMode::ValueError;
        } else {
          std::string buffer = allArgs[nextValueIndex++];
          while (nextValueIndex < allArgs.size() &&
                 allArgs[nextValueIndex][0] != '-') {
            buffer = cmStrCat(buffer, ";", allArgs[nextValueIndex++]);
          }
          parseState =
            this->StoreCall(buffer, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
          index = (nextValueIndex - 1);
        }
      } else {
        auto value = this->extract_single_value(input, parseState);
        if (parseState == ParseMode::Valid) {
          parseState =
            this->StoreCall(value, std::forward<CallState>(state)...)
            ? ParseMode::Valid
            : ParseMode::Invalid;
        }
      }
    }

    if (parseState == ParseMode::SyntaxError) {
      cmSystemTools::Error(
        cmStrCat("'", input, "'", this->InvalidSyntaxMessage));
    } else if (parseState == ParseMode::ValueError) {
      cmSystemTools::Error(this->InvalidValueMessage);
    }
    return (parseState == ParseMode::Valid);
  }